

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bconcat(bstring b0,const_bstring b1)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  ptrdiff_t pd;
  bstring aux;
  int d;
  int len;
  const_bstring b1_local;
  bstring b0_local;
  
  if ((((b0 == (bstring)0x0) || (b1 == (const_bstring)0x0)) || (b0->data == (uchar *)0x0)) ||
     (b1->data == (uchar *)0x0)) {
    b0_local._4_4_ = -1;
  }
  else {
    uVar1 = b0->slen;
    uVar2 = b1->slen;
    if ((int)(uVar1 | b0->mlen - uVar1 | uVar2 | uVar1 + uVar2) < 0) {
      b0_local._4_4_ = -1;
    }
    else {
      pd = (ptrdiff_t)b1;
      if (b0->mlen <= (int)(uVar1 + uVar2 + 1)) {
        lVar4 = (long)b1->data - (long)b0->data;
        if (((-1 < lVar4) && (lVar4 < b0->mlen)) &&
           (pd = (ptrdiff_t)bstrcpy(b1), (bstring)pd == (bstring)0x0)) {
          return -1;
        }
        iVar3 = balloc(b0,uVar1 + uVar2 + 1);
        if (iVar3 != 0) {
          if ((const_bstring)pd != b1) {
            bdestroy((bstring)pd);
          }
          return -1;
        }
      }
      if (uVar2 != 0) {
        memmove(b0->data + (int)uVar1,*(void **)(pd + 8),(long)(int)uVar2);
      }
      b0->data[(int)(uVar1 + uVar2)] = '\0';
      b0->slen = uVar1 + uVar2;
      if ((const_bstring)pd != b1) {
        bdestroy((bstring)pd);
      }
      b0_local._4_4_ = 0;
    }
  }
  return b0_local._4_4_;
}

Assistant:

int bconcat (bstring b0, const_bstring b1) {
int len, d;
bstring aux = (bstring) b1;

	if (b0 == NULL || b1 == NULL || b0->data == NULL || b1->data == NULL)
		return BSTR_ERR;

	d = b0->slen;
	len = b1->slen;
	if ((d | (b0->mlen - d) | len | (d + len)) < 0) return BSTR_ERR;

	if (b0->mlen <= d + len + 1) {
		ptrdiff_t pd = b1->data - b0->data;
		if (0 <= pd && pd < b0->mlen) {
			if (NULL == (aux = bstrcpy (b1))) return BSTR_ERR;
		}
		if (balloc (b0, d + len + 1) != BSTR_OK) {
			if (aux != b1) bdestroy (aux);
			return BSTR_ERR;
		}
	}

	bBlockCopy (&b0->data[d], &aux->data[0], (size_t) len);
	b0->data[d + len] = (unsigned char) '\0';
	b0->slen = d + len;
	if (aux != b1) bdestroy (aux);
	return BSTR_OK;
}